

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddFunction
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ParseableFunctionInfo *function,
          SRCINFO *srcInfo,ByteCodeCache *cache)

{
  code *pcVar1;
  PrintOffsets *deferredStubs_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  LocalFunctionId LVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  undefined4 extraout_var;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar9;
  BufferBuilderList *pBVar10;
  ImmutableList<Js::BufferBuilder_*> *pIVar11;
  BufferBuilderRelativeOffset *this_00;
  ParseableFunctionInfo *function_00;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  TrackAllocData local_140;
  BufferBuilderRelativeOffset *local_118;
  BufferBuilderRelativeOffset *offsetToNested;
  undefined8 local_108;
  TrackAllocData local_100;
  BufferBuilderList *local_d8;
  BufferBuilderList *nestedFunctionBuilder;
  FunctionInfo *nestedFunction;
  code *pcStack_c0;
  uint32 i;
  undefined8 local_b8;
  TrackAllocData local_b0;
  BufferBuilderList *local_88;
  BufferBuilderList *nestedBodyList;
  ScopeInfo *scopeInfo;
  PrintOffsets *printOffsets;
  DeferredFunctionStub *deferredStubs;
  Attributes attributes;
  uint displayNameLength;
  char16 *displayName;
  FunctionBody *functionBody;
  byte local_45;
  DWORD bitFlags;
  bool isAnonymous;
  SerializedFieldList SStack_40;
  uint32 sourceDiff;
  SerializedFieldList definedFields;
  ByteCodeCache *cache_local;
  SRCINFO *srcInfo_local;
  ParseableFunctionInfo *function_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  definedFields = (SerializedFieldList)cache;
  memset(&stack0xffffffffffffffc0,0,8);
  bitFlags = 0;
  uVar3 = ParseableFunctionInfo::StartOffset(function);
  bVar2 = TryConvertToUInt32((ulong)uVar3,&bitFlags);
  if (bVar2) {
    if (function->m_lineNumber != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffeffffffffffff | 0x1000000000000);
      PrependInt32(this,builder,L"Line Number",function->m_lineNumber,(BufferBuilderInt32 **)0x0);
    }
    if (function->m_columnNumber != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffdffffffffffff | 0x2000000000000);
      PrependInt32(this,builder,L"Column Number",function->m_columnNumber,(BufferBuilderInt32 **)0x0
                  );
    }
    local_45 = FunctionProxy::GetIsAnonymousFunction(&function->super_FunctionProxy);
    uVar4 = 0;
    if (((byte)(function->super_FunctionProxy).field_0x47 >> 2 & 1) != 0) {
      uVar4 = 2;
    }
    uVar23 = 0;
    if ((*(ushort *)&(function->super_FunctionProxy).field_0x45 >> 3 & 1) != 0) {
      uVar23 = 4;
    }
    uVar24 = 0;
    if ((*(ushort *)&(function->super_FunctionProxy).field_0x45 >> 4 & 1) != 0) {
      uVar24 = 0x40;
    }
    uVar25 = 0;
    if ((*(ushort *)&(function->super_FunctionProxy).field_0x45 >> 5 & 1) != 0) {
      uVar25 = 0x20000;
    }
    uVar26 = 0;
    if ((*(ushort *)&(function->super_FunctionProxy).field_0x45 >> 6 & 1) != 0) {
      uVar26 = 0x4000;
    }
    uVar27 = 0;
    if (((byte)((ushort)*(undefined2 *)&(function->super_FunctionProxy).field_0x45 >> 0xc) & 1) != 0
       ) {
      uVar27 = 8;
    }
    uVar28 = 0;
    if (((byte)(function->super_FunctionProxy).field_0x47 >> 3 & 1) != 0) {
      uVar28 = 0x10;
    }
    uVar12 = 0;
    if ((*(ushort *)&(function->super_FunctionProxy).field_0x45 & 0x100) != 0) {
      uVar12 = 0x80;
    }
    uVar13 = 0;
    if (((byte)((ushort)*(undefined2 *)&(function->super_FunctionProxy).field_0x45 >> 0xd) & 1) != 0
       ) {
      uVar13 = 0x100;
    }
    uVar14 = 0;
    if (((byte)((ushort)*(undefined2 *)&(function->super_FunctionProxy).field_0x45 >> 0xe) & 1) != 0
       ) {
      uVar14 = 0x400000;
    }
    uVar15 = 0;
    if (*(short *)&(function->super_FunctionProxy).field_0x45 < 0) {
      uVar15 = 0x200000;
    }
    uVar16 = 0;
    if (((function->super_FunctionProxy).field_0x47 & 1) != 0) {
      uVar16 = 0x200;
    }
    uVar17 = 0;
    if (((byte)(function->super_FunctionProxy).field_0x47 >> 1 & 1) != 0) {
      uVar17 = 0x400;
    }
    uVar18 = 0;
    if ((bool)local_45) {
      uVar18 = 0x100000;
    }
    uVar19 = 0;
    if (((byte)(function->super_FunctionProxy).field_0x47 >> 5 & 1) != 0) {
      uVar19 = 0x1000000;
    }
    uVar20 = 0;
    if ((*(ushort *)&(function->super_FunctionProxy).field_0x45 >> 7 & 1) != 0) {
      uVar20 = 0x2000000;
    }
    uVar21 = 0;
    if (((byte)((ushort)*(undefined2 *)&(function->super_FunctionProxy).field_0x45 >> 9) & 1) != 0)
    {
      uVar21 = 0x40000;
    }
    uVar22 = 0;
    if (((byte)((ushort)*(undefined2 *)&(function->super_FunctionProxy).field_0x45 >> 10) & 1) != 0)
    {
      uVar22 = 0x80000;
    }
    functionBody._4_4_ =
         (*(ushort *)&(function->super_FunctionProxy).field_0x45 >> 2 & 1) != 0 | uVar4 | uVar23 |
         uVar24 | uVar25 | uVar26 | uVar27 | uVar28 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 |
         uVar17 | uVar18 | uVar19 | uVar20 | uVar21 | uVar22;
    displayName = (char16 *)0x0;
    bVar2 = FunctionProxy::IsFunctionBody(&function->super_FunctionProxy);
    if (bVar2) {
      displayName = (char16 *)FunctionProxy::GetFunctionBody(&function->super_FunctionProxy);
      uVar4 = 0;
      if ((*(uint *)&((FunctionBody *)displayName)->field_0x178 >> 3 & 1) != 0) {
        uVar4 = 0x20;
      }
      uVar23 = 0;
      if ((*(uint *)&((FunctionBody *)displayName)->field_0x178 >> 0x15 & 1) != 0) {
        uVar23 = 0x800;
      }
      uVar24 = 0;
      if ((*(uint *)&((FunctionBody *)displayName)->field_0x178 >> 0x14 & 1) != 0) {
        uVar24 = 0x1000;
      }
      uVar25 = 0;
      if ((*(uint *)&((FunctionBody *)displayName)->field_0x178 & 0x1000000) != 0) {
        uVar25 = 0x2000;
      }
      uVar26 = 0;
      if ((*(uint *)&((FunctionBody *)displayName)->field_0x178 >> 0x17 & 1) != 0) {
        uVar26 = 0x8000;
      }
      uVar27 = 0;
      if (((byte)((uint)*(undefined4 *)&((FunctionBody *)displayName)->field_0x178 >> 0x19) & 1) !=
          0) {
        uVar27 = 0x10000;
      }
      uVar28 = 0;
      if (((byte)((uint)*(undefined4 *)&((FunctionBody *)displayName)->field_0x178 >> 0x1a) & 1) !=
          0) {
        uVar28 = 0x800000;
      }
      functionBody._4_4_ =
           uVar4 | uVar23 | uVar24 | uVar25 | uVar26 | uVar27 | uVar28 | functionBody._4_4_;
    }
    PrependConstantInt32
              (this,builder,L"BitFlags",functionBody._4_4_,(ConstantSizedBufferBuilderOf<int> **)0x0
              );
    if ((local_45 & 1) == 0) {
      iVar5 = (*(function->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject
                ._vptr_IRecyclerVisitedObject[7])();
      _attributes = (LPCWSTR)CONCAT44(extraout_var,iVar5);
      deferredStubs._4_4_ = function->m_displayNameLength;
      PrependString16(this,builder,L"Display Name",_attributes,(deferredStubs._4_4_ + 1) * 2);
    }
    LVar6 = FunctionProxy::GetLocalFunctionId(&function->super_FunctionProxy);
    PrependInt32(this,builder,L"Relative Function ID",LVar6 - this->topFunctionId,
                 (BufferBuilderInt32 **)0x0);
    deferredStubs._0_4_ = FunctionProxy::GetAttributes(&function->super_FunctionProxy);
    if (((Attributes)deferredStubs &
        ~(HomeObj|ComputedName|Method|BaseConstructorKind|AllowDirectSuper|CanDefer|
          EnclosedByGlobalFunc|Async|Generator|CapturesThis|Lambda|ClassConstructor|ClassMethod|
          SuperReference|DeferredParse|ErrorOnNew)) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x924,
                                  "((attributes & ~(FunctionInfo::Attributes::ErrorOnNew | FunctionInfo::Attributes::SuperReference | FunctionInfo::Attributes::Lambda | FunctionInfo::Attributes::Async | FunctionInfo::Attributes::CapturesThis | FunctionInfo::Attributes::Generator | FunctionInfo::Attributes::ClassConstructor | FunctionInfo::Attributes::BaseConstructorKind | FunctionInfo::Attributes::ClassMethod | FunctionInfo::Attributes::Method | FunctionInfo::Attributes::EnclosedByGlobalFunc | FunctionInfo::Attributes::AllowDirectSuper | FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::CanDefer | FunctionInfo::Attributes::ComputedName | FunctionInfo::Attributes::HomeObj)) == 0)"
                                  ,
                                  "Only the ErrorOnNew|SuperReference|Lambda|CapturesThis|Generator|ClassConstructor|BaseConstructorKind|Async|ClassMember|Method|EnclosedByGlobalFunc|AllowDirectSuper|ComputedName|DeferredParse|CanDefer|HomeObj attributes should be set on a serialized function"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    if ((Attributes)deferredStubs != None) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffbffffffffffff | 0x4000000000000);
      PrependInt32(this,builder,L"Attributes",(Attributes)deferredStubs,(BufferBuilderInt32 **)0x0);
    }
    PrependInt32(this,builder,L"Offset Into Source",bitFlags,(BufferBuilderInt32 **)0x0);
    uVar3 = ParseableFunctionInfo::PrintableStartOffset(function);
    PrependInt32(this,builder,L"Offset Into Source for toString",uVar3,(BufferBuilderInt32 **)0x0);
    uVar3 = ParseableFunctionInfo::GetNestedCount(function);
    if (uVar3 != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfff7ffffffffffff | 0x8000000000000);
      uVar3 = ParseableFunctionInfo::GetNestedCount(function);
      PrependInt32(this,builder,L"Nested count",uVar3,(BufferBuilderInt32 **)0x0);
    }
    printOffsets = (PrintOffsets *)ParseableFunctionInfo::GetDeferredStubs(function);
    if ((((DeferredFunctionStub *)printOffsets != (DeferredFunctionStub *)0x0) &&
        (((Attributes)deferredStubs & DeferredParse) != None)) &&
       (bVar2 = GenerateParserStateCache(this), deferredStubs_00 = printOffsets, bVar2)) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xf7ffffffffffffff | 0x800000000000000);
      uVar3 = ParseableFunctionInfo::GetNestedCount(function);
      AddDeferredStubs(this,builder,(DeferredFunctionStub *)deferredStubs_00,uVar3,
                       (ByteCodeCache *)definedFields,true);
    }
    scopeInfo = (ScopeInfo *)ParseableFunctionInfo::GetPrintOffsets(function);
    if (scopeInfo != (ScopeInfo *)0x0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xdfffffffffffffff | 0x2000000000000000);
      PrependInt32(this,builder,L"Start print offset",*(uint *)&(scopeInfo->parent).ptr,
                   (BufferBuilderInt32 **)0x0);
      PrependInt32(this,builder,L"End print offset",*(int *)((long)&(scopeInfo->parent).ptr + 4),
                   (BufferBuilderInt32 **)0x0);
    }
    nestedBodyList = (BufferBuilderList *)ParseableFunctionInfo::GetScopeInfo(function);
    if (((ScopeInfo *)nestedBodyList != (ScopeInfo *)0x0) &&
       (((Attributes)deferredStubs & (CanDefer|DeferredParse)) != None)) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xefffffffffffffff | 0x1000000000000000);
      AddScopeInfo(this,builder,(ScopeInfo *)nestedBodyList);
    }
    if (function->flags != Flags_None) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffffffffffffffe | 1);
      PrependFunctionBodyFlags(this,builder,L"flags",function->flags);
    }
    if (function->m_grfscr != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffffffffffffffd | 2);
      PrependInt32(this,builder,L"m_grfscr",function->m_grfscr,(BufferBuilderInt32 **)0x0);
    }
    if (function->m_inParamCount != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffffffffffffffb | 4);
      PrependInt16(this,builder,L"m_inParamCount",function->m_inParamCount,
                   (BufferBuilderInt16 **)0x0);
    }
    if (function->m_reportedInParamCount != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffffffffffffff7 | 8);
      PrependInt16(this,builder,L"m_reportedInParamCount",function->m_reportedInParamCount,
                   (BufferBuilderInt16 **)0x0);
    }
    if (function->m_cchStartOffset != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xffffffffffffffef | 0x10);
      PrependInt32(this,builder,L"m_cchStartOffset",function->m_cchStartOffset,
                   (BufferBuilderInt32 **)0x0);
    }
    if (function->m_cchLength != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xffffffffffffffdf | 0x20);
      PrependInt32(this,builder,L"m_cchLength",function->m_cchLength,(BufferBuilderInt32 **)0x0);
    }
    if (function->m_cbLength != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xffffffffffffffbf | 0x40);
      PrependInt32(this,builder,L"m_cbLength",function->m_cbLength,(BufferBuilderInt32 **)0x0);
    }
    if (function->m_displayShortNameOffset != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xffffffffffffff7f | 0x80);
      PrependInt32(this,builder,L"m_displayShortNameOffset",function->m_displayShortNameOffset,
                   (BufferBuilderInt32 **)0x0);
    }
    if (function->scopeSlotArraySize != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffffffffffffeff | 0x100);
      PrependInt32(this,builder,L"scopeSlotArraySize",function->scopeSlotArraySize,
                   (BufferBuilderInt32 **)0x0);
    }
    if (function->paramScopeSlotArraySize != 0) {
      SStack_40 = (SerializedFieldList)((ulong)SStack_40 & 0xfffffffffffffdff | 0x200);
      PrependInt32(this,builder,L"paramScopeSlotArraySize",function->paramScopeSlotArraySize,
                   (BufferBuilderInt32 **)0x0);
    }
    AddPropertyIdsForScopeSlotArray(this,builder,function);
    if (displayName != (char16 *)0x0) {
      AddFunctionBody(this,builder,(FunctionBody *)displayName,srcInfo,&stack0xffffffffffffffc0);
    }
    uVar3 = ParseableFunctionInfo::GetNestedCount(function);
    if (uVar3 != 0) {
      pAVar9 = &this->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_b0,(type_info *)&BufferBuilderList::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                 ,0x967);
      pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar9,&local_b0);
      pcStack_c0 = Memory::ArenaAllocator::Alloc;
      local_b8 = 0;
      pBVar10 = (BufferBuilderList *)
                new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar9,0x3f67b0);
      BufferBuilderList::BufferBuilderList(pBVar10,L"Nest Function Bodies");
      local_88 = pBVar10;
      for (nestedFunction._4_4_ = 0; uVar4 = nestedFunction._4_4_,
          uVar3 = ParseableFunctionInfo::GetNestedCount(function), uVar4 < uVar3;
          nestedFunction._4_4_ = nestedFunction._4_4_ + 1) {
        nestedFunctionBuilder =
             (BufferBuilderList *)
             ParseableFunctionInfo::GetNestedFunc(function,nestedFunction._4_4_);
        if (((FunctionInfo *)nestedFunctionBuilder == (FunctionInfo *)0x0) ||
           (BVar7 = FunctionInfo::HasParseableInfo((FunctionInfo *)nestedFunctionBuilder),
           BVar7 == 0)) {
          PrependConstantInt32
                    (this,builder,L"Empty Nested Function",0,
                     (ConstantSizedBufferBuilderOf<int> **)0x0);
        }
        else {
          pAVar9 = &this->alloc->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_100,(type_info *)&BufferBuilderList::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                     ,0x972);
          pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo(pAVar9,&local_100);
          offsetToNested = (BufferBuilderRelativeOffset *)Memory::ArenaAllocator::Alloc;
          local_108 = 0;
          pBVar10 = (BufferBuilderList *)
                    new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar9,0x3f67b0);
          BufferBuilderList::BufferBuilderList(pBVar10,L"Nested Function");
          local_d8 = pBVar10;
          pIVar11 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                              (local_88->list,(BufferBuilder *)pBVar10,this->alloc);
          local_88->list = pIVar11;
          pAVar9 = &this->alloc->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_140,(type_info *)&BufferBuilderRelativeOffset::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                     ,0x974);
          pAVar9 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo(pAVar9,&local_140);
          this_00 = (BufferBuilderRelativeOffset *)
                    new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar9,0x3f67b0);
          BufferBuilderRelativeOffset::BufferBuilderRelativeOffset
                    (this_00,L"Offset To Nested Function",&local_d8->super_BufferBuilder);
          local_118 = this_00;
          pIVar11 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                              (builder->list,(BufferBuilder *)this_00,this->alloc);
          pBVar10 = local_d8;
          builder->list = pIVar11;
          function_00 = FunctionInfo::GetParseableFunctionInfo
                                  ((FunctionInfo *)nestedFunctionBuilder);
          AddFunction(this,pBVar10,function_00,srcInfo,(ByteCodeCache *)definedFields);
        }
      }
      pIVar11 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                          (builder->list,&local_88->super_BufferBuilder,this->alloc);
      builder->list = pIVar11;
    }
    pIVar11 = regex::ImmutableList<Js::BufferBuilder_*>::ReverseCurrentList(builder->list);
    builder->list = pIVar11;
    PrependStruct<Js::SerializedFieldList>
              (this,builder,L"Serialized Field List",&stack0xffffffffffffffc0);
    this_local._4_4_ = 0;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x8ce,"(0)","0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
    this_local._4_4_ = -0x7ffdfdff;
  }
  return this_local._4_4_;
}

Assistant:

HRESULT AddFunction(BufferBuilderList & builder, ParseableFunctionInfo * function, SRCINFO const * srcInfo, ByteCodeCache* cache)
    {
        SerializedFieldList definedFields = { 0 };

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        PrependInt32(builder, _u("Start Function Table"), magicStartOfFunctionBody);
#endif

        uint32 sourceDiff = 0;

        if (!TryConvertToUInt32(function->StartOffset(), &sourceDiff))
        {
            Assert(0); // Likely a bug
            return ByteCodeSerializer::CantGenerate;
        }

        if (function->m_lineNumber != 0)
        {
            definedFields.has_m_lineNumber = true;
            PrependInt32(builder, _u("Line Number"), function->m_lineNumber);
        }

        if (function->m_columnNumber != 0)
        {
            definedFields.has_m_columnNumber = true;
            PrependInt32(builder, _u("Column Number"), function->m_columnNumber);
        }

        bool isAnonymous = function->GetIsAnonymousFunction();

        // FunctionBody Details
        DWORD bitFlags =
            (function->m_isDeclaration ? ffIsDeclaration : 0)
            | (function->m_hasImplicitArgIns ? ffHasImplicitArgsIn : 0)
            | (function->m_isAccessor ? ffIsAccessor : 0)
            | (function->m_isStaticNameFunction ? ffIsStaticNameFunction : 0)
            | (function->m_isNamedFunctionExpression ? ffIsNamedFunctionExpression : 0)
            | (function->m_isNameIdentifierRef ? ffIsNameIdentifierRef : 0)
            | (function->m_isGlobalFunc ? ffIsGlobalFunc : 0)
            | (function->m_dontInline ? ffDontInline : 0)
            | (function->m_isStrictMode ? ffIsStrictMode : 0)
            | (function->m_doBackendArgumentsOptimization ? ffDoBackendArgumentsOptimization : 0)
            | (function->m_doScopeObjectCreation ? ffDoScopeObjectCreation : 0)
            | (function->m_usesArgumentsObject ? ffUsesArgumentsObject : 0)
            | (function->m_isEval ? ffIsEval : 0)
            | (function->m_isDynamicFunction ? ffIsDynamicFunction : 0)
            | (isAnonymous ? ffIsAnonymous : 0)
            | (function->m_isMethod ? ffIsMethod : 0)
            | (function->m_isClassMember ? ffIsClassMember : 0)
#ifdef ASMJS_PLAT
            | (function->m_isAsmjsMode ? ffIsAsmJsMode : 0)
            | (function->m_isAsmJsFunction ? ffIsAsmJsFunction : 0)
#endif
            ;

        FunctionBody *functionBody = nullptr;
        if (function->IsFunctionBody())
        {
            functionBody = function->GetFunctionBody();

            bitFlags |=
                (functionBody->m_isFuncRegistered ? ffIsFuncRegistered : 0)
                | (functionBody->m_hasAllNonLocalReferenced ? ffhasAllNonLocalReferenced : 0)
                | (functionBody->m_hasSetIsObject ? ffhasSetIsObject : 0)
                | (functionBody->m_CallsEval ? ffhasSetCallsEval : 0)
                | (functionBody->m_ChildCallsEval ? ffChildCallsEval : 0)
                | (functionBody->m_hasReferenceableBuiltInArguments ? ffHasReferenceableBuiltInArguments : 0)
                | (functionBody->m_isParamAndBodyScopeMerged ? ffIsParamAndBodyScopeMerged : 0);
        }

        PrependConstantInt32(builder, _u("BitFlags"), bitFlags);

        if (!isAnonymous)
        {
            const char16* displayName = function->GetDisplayName();
            uint displayNameLength = function->m_displayNameLength;
            PrependString16(builder, _u("Display Name"), displayName, (displayNameLength + 1) * sizeof(char16));
        }

        PrependInt32(builder, _u("Relative Function ID"), function->GetLocalFunctionId() - topFunctionId); // Serialized function ids are relative to the top function ID
        auto attributes = function->GetAttributes();
        AssertMsg((attributes &
            ~(FunctionInfo::Attributes::ErrorOnNew
                | FunctionInfo::Attributes::SuperReference
                | FunctionInfo::Attributes::Lambda
                | FunctionInfo::Attributes::Async
                | FunctionInfo::Attributes::CapturesThis
                | FunctionInfo::Attributes::Generator
                | FunctionInfo::Attributes::ClassConstructor
                | FunctionInfo::Attributes::BaseConstructorKind
                | FunctionInfo::Attributes::ClassMethod
                | FunctionInfo::Attributes::Method
                | FunctionInfo::Attributes::EnclosedByGlobalFunc
                | FunctionInfo::Attributes::AllowDirectSuper
                | FunctionInfo::Attributes::DeferredParse
                | FunctionInfo::Attributes::CanDefer
                | FunctionInfo::Attributes::ComputedName
                | FunctionInfo::Attributes::HomeObj)) == 0,
            "Only the ErrorOnNew|SuperReference|Lambda|CapturesThis|Generator|ClassConstructor|BaseConstructorKind|Async|ClassMember|Method|EnclosedByGlobalFunc|AllowDirectSuper|ComputedName|DeferredParse|CanDefer|HomeObj attributes should be set on a serialized function");
        if (attributes != FunctionInfo::Attributes::None)
        {
            definedFields.has_attributes = true;
            PrependInt32(builder, _u("Attributes"), attributes);
        }

        PrependInt32(builder, _u("Offset Into Source"), sourceDiff);
        PrependInt32(builder, _u("Offset Into Source for toString"), function->PrintableStartOffset());
        if (function->GetNestedCount() > 0)
        {
            definedFields.has_m_nestedCount = true;
            PrependInt32(builder, _u("Nested count"), function->GetNestedCount());
        }

        DeferredFunctionStub* deferredStubs = function->GetDeferredStubs();
        if (deferredStubs != nullptr
            && (attributes & FunctionInfo::Attributes::DeferredParse) != 0
            && GenerateParserStateCache())
        {
            definedFields.has_deferredStubs = true;
            AddDeferredStubs(builder, deferredStubs, function->GetNestedCount(), cache, true);
        }

        PrintOffsets* printOffsets = function->GetPrintOffsets();
        if (printOffsets != nullptr)
        {
            definedFields.has_printOffsets = true;
            PrependInt32(builder, _u("Start print offset"), printOffsets->cbStartPrintOffset);
            PrependInt32(builder, _u("End print offset"), printOffsets->cbEndPrintOffset);
        }

        ScopeInfo* scopeInfo = function->GetScopeInfo();
        if (scopeInfo != nullptr
            && (attributes & (FunctionInfo::Attributes::DeferredParse | FunctionInfo::Attributes::CanDefer)) != 0)
        {
            definedFields.has_scopeInfo = true;
            AddScopeInfo(builder, scopeInfo);
        }

#define PrependArgSlot PrependInt16
#define PrependRegSlot PrependInt32
#define PrependCharCount PrependInt32
#define PrependULong PrependInt32
#define PrependUInt16 PrependInt16
#define PrependUInt32 PrependInt32

#define DEFINE_FUNCTION_PROXY_FIELDS 1
#define DEFINE_PARSEABLE_FUNCTION_INFO_FIELDS 1
#define DECLARE_SERIALIZABLE_FIELD(type, name, serializableType) \
        if (function->##name != 0) { \
            definedFields.has_##name = true; \
            Prepend##serializableType(builder, _u(#name), function->##name); \
        }

#include "SerializableFunctionFields.h"

        AddPropertyIdsForScopeSlotArray(builder, function);

        if (functionBody != nullptr)
        {
            AddFunctionBody(builder, functionBody, srcInfo, definedFields);
        }

        // Lastly, write each of the lexically enclosed functions
        if (function->GetNestedCount())
        {
            auto nestedBodyList = Anew(alloc, BufferBuilderList, _u("Nest Function Bodies"));

            for (uint32 i = 0; i < function->GetNestedCount(); ++i)
            {
                auto nestedFunction = function->GetNestedFunc(i);
                if (nestedFunction == nullptr || !nestedFunction->HasParseableInfo())
                {
                    PrependConstantInt32(builder, _u("Empty Nested Function"), 0);
                }
                else
                {
                    auto nestedFunctionBuilder = Anew(alloc, BufferBuilderList, _u("Nested Function"));
                    nestedBodyList->list = nestedBodyList->list->Prepend(nestedFunctionBuilder, alloc);
                    auto offsetToNested = Anew(alloc, BufferBuilderRelativeOffset, _u("Offset To Nested Function"), nestedFunctionBuilder);
                    builder.list = builder.list->Prepend(offsetToNested, alloc);
                    AddFunction(*nestedFunctionBuilder, nestedFunction->GetParseableFunctionInfo(), srcInfo, cache);
                }
            }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
            PrependInt32(builder, _u("End Function Body"), magicEndOfFunctionBody);
#endif

            builder.list = builder.list->Prepend(nestedBodyList, alloc);
        }
        else
        {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
            PrependInt32(builder, _u("End Function Body"), magicEndOfFunctionBody);
#endif
        }

        // Reverse to put prepended items in correct order
        builder.list = builder.list->ReverseCurrentList();
        PrependStruct<SerializedFieldList>(builder, _u("Serialized Field List"), &definedFields);

        return S_OK;
    }